

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjDecodeYUVPlanes(tjhandle handle,uchar **srcPlanes,int *strides,int subsamp,uchar *dstBuf,
                     int width,int pitch,int height,int pixelFormat,int flags)

{
  JSAMPROW pJVar1;
  JDIMENSION JVar2;
  int iVar3;
  char *pcVar4;
  void *pvVar5;
  int in_ECX;
  long in_RDX;
  long *in_RSI;
  JSAMPARRAY in_RDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000008;
  JDIMENSION outrow;
  JDIMENSION inrow;
  uchar *_tmpbuf_aligned;
  j_decompress_ptr dinfo;
  tjinstance *this;
  _func_void_j_decompress_ptr *old_reset_marker_reader;
  _func_int_j_decompress_ptr *old_read_markers;
  jpeg_component_info *compptr;
  JSAMPLE *ptr;
  int ph [10];
  int pw [10];
  int ph0;
  int pw0;
  int row;
  int retval;
  int i;
  JSAMPROW *inbuf [10];
  JSAMPROW *tmpbuf [10];
  JSAMPLE *_tmpbuf [10];
  JSAMPROW *row_pointer;
  boolean in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  jpeg_decompress_struct *in_stack_fffffffffffffe20;
  JSAMPARRAY ppJVar6;
  undefined8 uVar7;
  JSAMPARRAY input_array;
  long local_1b0;
  int aiStack_1a8 [12];
  int aiStack_178 [11];
  uint local_14c;
  uint local_148;
  int local_144;
  int local_140;
  JDIMENSION local_13c;
  long alStack_138 [10];
  long local_e8 [10];
  long alStack_98 [11];
  void *local_40;
  int local_34;
  long local_30;
  long local_20;
  long *local_18;
  int local_4;
  
  local_40 = (void *)0x0;
  local_140 = 0;
  if (in_RDI == (JSAMPARRAY)0x0) {
    pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(pcVar4,200,"Invalid handle");
    local_4 = -1;
  }
  else {
    ppJVar6 = in_RDI + 0x41;
    *(undefined4 *)(in_RDI + 0xbf) = 0;
    *(undefined4 *)(in_RDI + 0xda) = 0;
    *(uint *)((long)in_RDI + 0x5fc) = (uint)(((uint)dinfo & 0x2000) != 0);
    for (local_13c = 0; (int)local_13c < 10; local_13c = local_13c + 1) {
      local_e8[(int)local_13c] = 0;
      alStack_98[(int)local_13c] = 0;
      alStack_138[(int)local_13c] = 0;
    }
    if (((ulong)in_RDI[0xc0] & 2) == 0) {
      snprintf((char *)(in_RDI + 0xc1),200,"%s",
               "tjDecodeYUVPlanes(): Instance has not been initialized for decompression");
      *(undefined4 *)(in_RDI + 0xda) = 1;
      pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
      snprintf(pcVar4,200,"%s",
               "tjDecodeYUVPlanes(): Instance has not been initialized for decompression");
      local_140 = -1;
    }
    else if (((((((in_RSI == (long *)0x0) || (*in_RSI == 0)) || (in_ECX < 0)) ||
               ((5 < in_ECX || (in_R8 == 0)))) ||
              ((in_R9D < 1 || ((in_stack_00000008 < 0 || ((int)outrow < 1)))))) ||
             ((int)_tmpbuf_aligned < 0)) || (0xb < (int)_tmpbuf_aligned)) {
      snprintf((char *)(in_RDI + 0xc1),200,"%s","tjDecodeYUVPlanes(): Invalid argument");
      *(undefined4 *)(in_RDI + 0xda) = 1;
      pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
      snprintf(pcVar4,200,"%s","tjDecodeYUVPlanes(): Invalid argument");
      local_140 = -1;
    }
    else if ((in_ECX == 3) || ((in_RSI[1] != 0 && (in_RSI[2] != 0)))) {
      local_34 = in_R9D;
      local_30 = in_R8;
      local_20 = in_RDX;
      local_18 = in_RSI;
      iVar3 = _setjmp((__jmp_buf_tag *)(in_RDI + 0xa5));
      if (iVar3 == 0) {
        if ((int)_tmpbuf_aligned == 0xb) {
          snprintf((char *)(in_RDI + 0xc1),200,"%s",
                   "tjDecodeYUVPlanes(): Cannot decode YUV images into CMYK pixels.");
          *(undefined4 *)(in_RDI + 0xda) = 1;
          pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
          snprintf(pcVar4,200,"%s","tjDecodeYUVPlanes(): Cannot decode YUV images into CMYK pixels."
                  );
          local_140 = -1;
        }
        else {
          if (in_stack_00000008 == 0) {
            in_stack_00000008 = local_34 * tjPixelSize[(int)_tmpbuf_aligned];
          }
          *(int *)(ppJVar6 + 6) = local_34;
          *(JDIMENSION *)((long)ppJVar6 + 0x34) = outrow;
          if (((uint)dinfo & 8) == 0) {
            if (((uint)dinfo & 0x10) == 0) {
              if (((uint)dinfo & 0x20) != 0) {
                putenv("JSIMD_FORCESSE2=1");
              }
            }
            else {
              putenv("JSIMD_FORCESSE=1");
            }
          }
          else {
            putenv("JSIMD_FORCEMMX=1");
          }
          pJVar1 = ppJVar6[0x48];
          pJVar1[0x20] = '\0';
          pJVar1[0x21] = '\0';
          pJVar1[0x22] = '\0';
          pJVar1[0x23] = '\0';
          *(undefined4 *)(ppJVar6 + 0x27) = 0;
          *(undefined4 *)(ppJVar6 + 0x43) = 0;
          *(undefined4 *)((long)ppJVar6 + 0x214) = 0;
          *(undefined4 *)((long)ppJVar6 + 0x20c) = 0;
          *(undefined4 *)(ppJVar6 + 0x42) = 0x3f;
          iVar3 = setDecodeDefaults(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                                    in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
          if (iVar3 == -1) {
            local_140 = -1;
          }
          else {
            input_array = *(JSAMPARRAY *)(ppJVar6[0x49] + 8);
            *(code **)(ppJVar6[0x49] + 8) = my_read_markers;
            uVar7 = *(undefined8 *)ppJVar6[0x49];
            *(code **)ppJVar6[0x49] = my_reset_marker_reader;
            jpeg_read_header((j_decompress_ptr)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                             in_stack_fffffffffffffe0c);
            *(JSAMPARRAY *)(ppJVar6[0x49] + 8) = input_array;
            *(undefined8 *)ppJVar6[0x49] = uVar7;
            *(J_COLOR_SPACE *)(in_RDI + 0x49) = pf2cs[(int)_tmpbuf_aligned];
            if (((uint)dinfo & 0x800) != 0) {
              *(undefined4 *)(in_RDI + 0x4d) = 1;
            }
            *(undefined4 *)((long)ppJVar6 + 100) = 0;
            *(undefined4 *)(ppJVar6 + 0x42) = 0x3f;
            jinit_master_decompress
                      ((j_decompress_ptr)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
            (**(code **)ppJVar6[0x4c])(ppJVar6);
            local_148 = (local_34 + *(int *)(ppJVar6 + 0x33)) - 1U &
                        (*(int *)(ppJVar6 + 0x33) - 1U ^ 0xffffffff);
            local_14c = (outrow + *(int *)((long)ppJVar6 + 0x19c)) - 1 &
                        (*(int *)((long)ppJVar6 + 0x19c) - 1U ^ 0xffffffff);
            if (in_stack_00000008 == 0) {
              in_stack_00000008 = *(int *)(ppJVar6 + 0x11) * tjPixelSize[(int)_tmpbuf_aligned];
            }
            local_40 = malloc((long)(int)local_14c << 3);
            if (local_40 == (void *)0x0) {
              snprintf((char *)(in_RDI + 0xc1),200,"%s",
                       "tjDecodeYUVPlanes(): Memory allocation failure");
              *(undefined4 *)(in_RDI + 0xda) = 1;
              pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
              snprintf(pcVar4,200,"%s","tjDecodeYUVPlanes(): Memory allocation failure");
              local_140 = -1;
            }
            else {
              for (local_13c = 0; (int)local_13c < (int)outrow; local_13c = local_13c + 1) {
                if (((uint)dinfo & 2) == 0) {
                  *(long *)((long)local_40 + (long)(int)local_13c * 8) =
                       local_30 + (long)(int)local_13c * (long)in_stack_00000008;
                }
                else {
                  *(long *)((long)local_40 + (long)(int)local_13c * 8) =
                       local_30 + (long)(int)((outrow - local_13c) + -1) * (long)in_stack_00000008;
                }
              }
              if ((int)outrow < (int)local_14c) {
                for (local_13c = outrow; (int)local_13c < (int)local_14c; local_13c = local_13c + 1)
                {
                  *(undefined8 *)((long)local_40 + (long)(int)local_13c * 8) =
                       *(undefined8 *)((long)local_40 + (long)(int)(outrow - 1) * 8);
                }
              }
              for (local_13c = 0; JVar2 = local_13c, (int)local_13c < *(int *)(ppJVar6 + 7);
                  local_13c = local_13c + 1) {
                pJVar1 = ppJVar6[0x26];
                pvVar5 = malloc((ulong)((*(int *)(pJVar1 + (long)(int)local_13c * 0x60 + 0x1c) * 8 +
                                         0x1fU & 0xffffffe0) *
                                        *(int *)(pJVar1 + (long)(int)local_13c * 0x60 + 0xc) + 0x20)
                               );
                alStack_98[(int)local_13c] = (long)pvVar5;
                if (alStack_98[(int)local_13c] == 0) {
                  snprintf((char *)(in_RDI + 0xc1),200,"%s",
                           "tjDecodeYUVPlanes(): Memory allocation failure");
                  *(undefined4 *)(in_RDI + 0xda) = 1;
                  pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
                  snprintf(pcVar4,200,"%s","tjDecodeYUVPlanes(): Memory allocation failure");
                  local_140 = -1;
                  goto LAB_0017d901;
                }
                pvVar5 = malloc((long)*(int *)(pJVar1 + (long)(int)JVar2 * 0x60 + 0xc) << 3);
                local_e8[(int)local_13c] = (long)pvVar5;
                if (local_e8[(int)local_13c] == 0) {
                  snprintf((char *)(in_RDI + 0xc1),200,"%s",
                           "tjDecodeYUVPlanes(): Memory allocation failure");
                  *(undefined4 *)(in_RDI + 0xda) = 1;
                  pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
                  snprintf(pcVar4,200,"%s","tjDecodeYUVPlanes(): Memory allocation failure");
                  local_140 = -1;
                  goto LAB_0017d901;
                }
                for (local_144 = 0; local_144 < *(int *)(pJVar1 + (long)(int)JVar2 * 0x60 + 0xc);
                    local_144 = local_144 + 1) {
                  in_stack_fffffffffffffe20 =
                       (jpeg_decompress_struct *)
                       (alStack_98[(int)local_13c] + 0x1fU & 0xffffffffffffffe0);
                  *(ulong *)(local_e8[(int)local_13c] + (long)local_144 * 8) =
                       (long)&in_stack_fffffffffffffe20->err +
                       (ulong)((*(int *)(pJVar1 + (long)(int)JVar2 * 0x60 + 0x1c) * 8 + 0x1fU &
                               0xffffffe0) * local_144);
                }
                aiStack_178[(int)local_13c] =
                     (int)(local_148 * *(int *)(pJVar1 + (long)(int)JVar2 * 0x60 + 8)) /
                     *(int *)(ppJVar6 + 0x33);
                aiStack_1a8[(int)local_13c] =
                     (int)(local_14c * *(int *)(pJVar1 + (long)(int)JVar2 * 0x60 + 0xc)) /
                     *(int *)((long)ppJVar6 + 0x19c);
                pvVar5 = malloc((long)aiStack_1a8[(int)local_13c] << 3);
                alStack_138[(int)local_13c] = (long)pvVar5;
                if (alStack_138[(int)local_13c] == 0) {
                  snprintf((char *)(in_RDI + 0xc1),200,"%s",
                           "tjDecodeYUVPlanes(): Memory allocation failure");
                  *(undefined4 *)(in_RDI + 0xda) = 1;
                  pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
                  snprintf(pcVar4,200,"%s","tjDecodeYUVPlanes(): Memory allocation failure");
                  local_140 = -1;
                  goto LAB_0017d901;
                }
                local_1b0 = local_18[(int)local_13c];
                for (local_144 = 0; local_144 < aiStack_1a8[(int)local_13c];
                    local_144 = local_144 + 1) {
                  *(long *)(alStack_138[(int)local_13c] + (long)local_144 * 8) = local_1b0;
                  if ((local_20 == 0) || (*(int *)(local_20 + (long)(int)local_13c * 4) == 0)) {
                    iVar3 = aiStack_178[(int)local_13c];
                  }
                  else {
                    iVar3 = *(int *)(local_20 + (long)(int)local_13c * 4);
                  }
                  local_1b0 = local_1b0 + iVar3;
                }
              }
              iVar3 = _setjmp((__jmp_buf_tag *)(in_RDI + 0xa5));
              if (iVar3 == 0) {
                for (local_144 = 0; local_144 < (int)local_14c;
                    local_144 = *(int *)((long)ppJVar6 + 0x19c) + local_144) {
                  for (local_13c = 0; (int)local_13c < *(int *)(ppJVar6 + 7);
                      local_13c = local_13c + 1) {
                    jcopy_sample_rows(input_array,(int)((ulong)uVar7 >> 0x20),in_RDI,
                                      (int)((ulong)ppJVar6 >> 0x20),(int)ppJVar6,
                                      (JDIMENSION)((ulong)in_stack_fffffffffffffe20 >> 0x20));
                  }
                  (**(code **)(ppJVar6[0x4c] + 8))
                            (ppJVar6,local_e8,&stack0xfffffffffffffe1c,
                             *(undefined4 *)((long)ppJVar6 + 0x19c),
                             (void *)((long)local_40 + (long)local_144 * 8),&stack0xfffffffffffffe18
                             ,*(undefined4 *)((long)ppJVar6 + 0x19c));
                }
                jpeg_abort_decompress((j_decompress_ptr)0x17d901);
              }
              else {
                local_140 = -1;
              }
            }
          }
        }
      }
      else {
        local_140 = -1;
      }
    }
    else {
      snprintf((char *)(in_RDI + 0xc1),200,"%s","tjDecodeYUVPlanes(): Invalid argument");
      *(undefined4 *)(in_RDI + 0xda) = 1;
      pcVar4 = (char *)__tls_get_addr(&PTR_001e8fc0);
      snprintf(pcVar4,200,"%s","tjDecodeYUVPlanes(): Invalid argument");
      local_140 = -1;
    }
LAB_0017d901:
    if (200 < *(int *)((long)ppJVar6 + 0x24)) {
      jpeg_abort_decompress((j_decompress_ptr)0x17d919);
    }
    free(local_40);
    for (local_13c = 0; (int)local_13c < 10; local_13c = local_13c + 1) {
      free((void *)local_e8[(int)local_13c]);
      free((void *)alStack_98[(int)local_13c]);
      free((void *)alStack_138[(int)local_13c]);
    }
    if (*(int *)(in_RDI + 0xbf) != 0) {
      local_140 = -1;
    }
    *(undefined4 *)((long)in_RDI + 0x5fc) = 0;
    local_4 = local_140;
  }
  return local_4;
}

Assistant:

DLLEXPORT int tjDecodeYUVPlanes(tjhandle handle,
                                const unsigned char **srcPlanes,
                                const int *strides, int subsamp,
                                unsigned char *dstBuf, int width, int pitch,
                                int height, int pixelFormat, int flags)
{
  JSAMPROW *row_pointer = NULL;
  JSAMPLE *_tmpbuf[MAX_COMPONENTS];
  JSAMPROW *tmpbuf[MAX_COMPONENTS], *inbuf[MAX_COMPONENTS];
  int i, retval = 0, row, pw0, ph0, pw[MAX_COMPONENTS], ph[MAX_COMPONENTS];
  JSAMPLE *ptr;
  jpeg_component_info *compptr;
  int (*old_read_markers) (j_decompress_ptr);
  void (*old_reset_marker_reader) (j_decompress_ptr);

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  _tmpbuf[i] = NULL;  inbuf[i] = NULL;
  }

  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecodeYUVPlanes(): Instance has not been initialized for decompression");

  if (!srcPlanes || !srcPlanes[0] || subsamp < 0 || subsamp >= NUMSUBOPT ||
      dstBuf == NULL || width <= 0 || pitch < 0 || height <= 0 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF)
    THROW("tjDecodeYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!srcPlanes[1] || !srcPlanes[2]))
    THROW("tjDecodeYUVPlanes(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (pixelFormat == TJPF_CMYK)
    THROW("tjDecodeYUVPlanes(): Cannot decode YUV images into CMYK pixels.");

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];
  dinfo->image_width = width;
  dinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  dinfo->progressive_mode = dinfo->inputctl->has_multiple_scans = FALSE;
  dinfo->Ss = dinfo->Ah = dinfo->Al = 0;
  dinfo->Se = DCTSIZE2 - 1;
  if (setDecodeDefaults(dinfo, pixelFormat, subsamp, flags) == -1) {
    retval = -1;  goto bailout;
  }
  old_read_markers = dinfo->marker->read_markers;
  dinfo->marker->read_markers = my_read_markers;
  old_reset_marker_reader = dinfo->marker->reset_marker_reader;
  dinfo->marker->reset_marker_reader = my_reset_marker_reader;
  jpeg_read_header(dinfo, TRUE);
  dinfo->marker->read_markers = old_read_markers;
  dinfo->marker->reset_marker_reader = old_reset_marker_reader;

  this->dinfo.out_color_space = pf2cs[pixelFormat];
  if (flags & TJFLAG_FASTDCT) this->dinfo.dct_method = JDCT_FASTEST;
  dinfo->do_fancy_upsampling = FALSE;
  dinfo->Se = DCTSIZE2 - 1;
  jinit_master_decompress(dinfo);
  (*dinfo->upsample->start_pass) (dinfo);

  pw0 = PAD(width, dinfo->max_h_samp_factor);
  ph0 = PAD(height, dinfo->max_v_samp_factor);

  if (pitch == 0) pitch = dinfo->output_width * tjPixelSize[pixelFormat];

  if ((row_pointer = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph0)) == NULL)
    THROW("tjDecodeYUVPlanes(): Memory allocation failure");
  for (i = 0; i < height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = &dstBuf[(height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = &dstBuf[i * (size_t)pitch];
  }
  if (height < ph0)
    for (i = height; i < ph0; i++) row_pointer[i] = row_pointer[height - 1];

  for (i = 0; i < dinfo->num_components; i++) {
    compptr = &dinfo->comp_info[i];
    _tmpbuf[i] =
      (JSAMPLE *)malloc(PAD(compptr->width_in_blocks * DCTSIZE, 32) *
                        compptr->v_samp_factor + 32);
    if (!_tmpbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * compptr->v_samp_factor);
    if (!tmpbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < compptr->v_samp_factor; row++) {
      unsigned char *_tmpbuf_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf[i], 32);

      tmpbuf[i][row] =
        &_tmpbuf_aligned[PAD(compptr->width_in_blocks * DCTSIZE, 32) * row];
    }
    pw[i] = pw0 * compptr->h_samp_factor / dinfo->max_h_samp_factor;
    ph[i] = ph0 * compptr->v_samp_factor / dinfo->max_v_samp_factor;
    inbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i]);
    if (!inbuf[i])
      THROW("tjDecodeYUVPlanes(): Memory allocation failure");
    ptr = (JSAMPLE *)srcPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      inbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < ph0; row += dinfo->max_v_samp_factor) {
    JDIMENSION inrow = 0, outrow = 0;

    for (i = 0, compptr = dinfo->comp_info; i < dinfo->num_components;
         i++, compptr++)
      jcopy_sample_rows(inbuf[i],
        row * compptr->v_samp_factor / dinfo->max_v_samp_factor, tmpbuf[i], 0,
        compptr->v_samp_factor, pw[i]);
    (dinfo->upsample->upsample) (dinfo, tmpbuf, &inrow,
                                 dinfo->max_v_samp_factor, &row_pointer[row],
                                 &outrow, dinfo->max_v_samp_factor);
  }
  jpeg_abort_decompress(dinfo);

bailout:
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  free(row_pointer);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(_tmpbuf[i]);
    free(inbuf[i]);
  }
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}